

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronization.cc
# Opt level: O3

void __thiscall
tchecker::system::synchronization_t::add_synchronization_constraint
          (synchronization_t *this,sync_constraint_t *constr)

{
  pointer *ppsVar1;
  iterator __position;
  event_id_t eVar2;
  sync_constraint_t *psVar3;
  invalid_argument *this_00;
  
  psVar3 = (this->_constraints).
           super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->_constraints).
       super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 != __position._M_current) {
    do {
      if (psVar3->_pid == constr->_pid) {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"process is already synchronized");
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      psVar3 = psVar3 + 1;
    } while (psVar3 != __position._M_current);
  }
  if (__position._M_current !=
      (this->_constraints).
      super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    (__position._M_current)->_strength = constr->_strength;
    eVar2 = constr->_event_id;
    (__position._M_current)->_pid = constr->_pid;
    (__position._M_current)->_event_id = eVar2;
    ppsVar1 = &(this->_constraints).
               super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppsVar1 = *ppsVar1 + 1;
    return;
  }
  std::
  vector<tchecker::system::sync_constraint_t,std::allocator<tchecker::system::sync_constraint_t>>::
  _M_realloc_insert<tchecker::system::sync_constraint_t_const&>
            ((vector<tchecker::system::sync_constraint_t,std::allocator<tchecker::system::sync_constraint_t>>
              *)&this->_constraints,__position,constr);
  return;
}

Assistant:

void synchronization_t::add_synchronization_constraint(tchecker::system::sync_constraint_t const & constr)
{
  // Check that process is not synchronized yet
  for (tchecker::system::sync_constraint_t const & c : _constraints)
    if (c.pid() == constr.pid())
      throw std::invalid_argument("process is already synchronized");
  _constraints.push_back(constr);
}